

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

bool __thiscall
cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
          (cmNinjaTargetGenerator *this,cmNinjaVars *vars,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *this_00;
  cmLocalNinjaGenerator *pcVar3;
  TargetType TVar4;
  cmValue cVar5;
  cmGlobalNinjaGenerator *pcVar6;
  string *psVar7;
  mapped_type *pmVar8;
  bool bVar9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view source;
  string_view source_00;
  string pdbPath;
  string compilePdbPath;
  string local_158;
  cmNinjaVars *local_138;
  string local_130;
  string local_f8;
  undefined1 *local_d8;
  undefined8 local_d0;
  size_type local_c8;
  pointer local_c0;
  string *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  paVar1 = &local_f8.field_2;
  local_138 = vars;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"MSVC_C_ARCHITECTURE_ID","");
  cVar5 = cmMakefile::GetDefinition(this_00,&local_f8);
  bVar9 = true;
  if (cVar5.Value == (string *)0x0) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"MSVC_CXX_ARCHITECTURE_ID","");
    cVar5 = cmMakefile::GetDefinition(this_00,&local_130);
    bVar9 = true;
    if (cVar5.Value == (string *)0x0) {
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"MSVC_CUDA_ARCHITECTURE_ID","");
      cVar5 = cmMakefile::GetDefinition(this_00,&local_158);
      bVar9 = cVar5.Value != (string *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                 local_158.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,
                      (ulong)(local_130.field_2._M_allocated_capacity + 1));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  if (bVar9 != false) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    cmCommonTargetGenerator::ComputeTargetCompilePDB
              (&local_70,&this->super_cmCommonTargetGenerator,config);
    TVar4 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((((TVar4 == EXECUTABLE) ||
         (TVar4 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
         TVar4 == STATIC_LIBRARY)) ||
        (TVar4 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
        TVar4 == SHARED_LIBRARY)) ||
       (TVar4 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
       TVar4 == MODULE_LIBRARY)) {
      cmGeneratorTarget::GetPDBDirectory
                (&local_90,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
      cmGeneratorTarget::GetPDBName
                (&local_b0,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
      local_f8._M_dataplus._M_p = (pointer)local_90._M_string_length;
      local_f8._M_string_length = (size_type)local_90._M_dataplus._M_p;
      local_130.field_2._M_allocated_capacity = (long)&local_130.field_2 + 8;
      local_130._M_dataplus._M_p = (pointer)0x0;
      local_130._M_string_length = 1;
      local_130.field_2._M_local_buf[8] = '/';
      local_f8.field_2._8_8_ = 1;
      local_d0 = 0;
      local_c8 = local_b0._M_string_length;
      local_c0 = local_b0._M_dataplus._M_p;
      views._M_len = 3;
      views._M_array = (iterator)&local_f8;
      local_f8.field_2._M_allocated_capacity = (size_type)&local_90;
      local_d8 = (undefined1 *)local_130.field_2._M_allocated_capacity;
      local_b8 = &local_b0;
      cmCatViews(&local_50,views);
      std::__cxx11::string::operator=((string *)&local_158,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar3 = this->LocalGenerator;
    pcVar6 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar3);
    psVar7 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar6,&local_158);
    source._M_str = (psVar7->_M_dataplus)._M_p;
    source._M_len = psVar7->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_f8,(cmOutputConverter *)pcVar3,source,SHELL,false);
    paVar2 = &local_130.field_2;
    local_130._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"TARGET_PDB","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_138,&local_130);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p,
                      (ulong)(local_130.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1))
      ;
    }
    pcVar3 = this->LocalGenerator;
    pcVar6 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar3);
    psVar7 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar6,&local_70);
    source_00._M_str = (psVar7->_M_dataplus)._M_p;
    source_00._M_len = psVar7->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_f8,(cmOutputConverter *)pcVar3,source_00,SHELL,false);
    local_130._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"TARGET_COMPILE_PDB","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_138,&local_130);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p,
                      (ulong)(local_130.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1))
      ;
    }
    EnsureParentDirectoryExists(this,&local_158);
    EnsureParentDirectoryExists(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
    return bVar9;
  }
  return false;
}

Assistant:

bool cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(
  cmNinjaVars& vars, const std::string& config) const
{
  cmMakefile* mf = this->GetMakefile();
  if (mf->GetDefinition("MSVC_C_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CXX_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CUDA_ARCHITECTURE_ID")) {
    std::string pdbPath;
    std::string compilePdbPath = this->ComputeTargetCompilePDB(config);
    if (this->GeneratorTarget->GetType() == cmStateEnums::EXECUTABLE ||
        this->GeneratorTarget->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->GeneratorTarget->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GeneratorTarget->GetType() == cmStateEnums::MODULE_LIBRARY) {
      pdbPath = cmStrCat(this->GeneratorTarget->GetPDBDirectory(config), '/',
                         this->GeneratorTarget->GetPDBName(config));
    }

    vars["TARGET_PDB"] = this->GetLocalGenerator()->ConvertToOutputFormat(
      this->ConvertToNinjaPath(pdbPath), cmOutputConverter::SHELL);
    vars["TARGET_COMPILE_PDB"] =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        this->ConvertToNinjaPath(compilePdbPath), cmOutputConverter::SHELL);

    this->EnsureParentDirectoryExists(pdbPath);
    this->EnsureParentDirectoryExists(compilePdbPath);
    return true;
  }
  return false;
}